

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

bool UTF_u8_to_U<(char)63>(UTF_US8 *us8,UTF_US32 *us32)

{
  UTF_UC8 uc8_00;
  bool bVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  char32_t __c;
  UTF_UC8 *pUVar4;
  UTF_UC8 *pUVar5;
  UTF_UC8 *pUVar6;
  UTF_UC8 uc8 [4];
  UTF_UC32 uc32;
  
  pUVar5 = (us8->_M_dataplus)._M_p;
  pUVar6 = pUVar5 + us8->_M_string_length;
  _uc8 = in_RAX;
  do {
    if (pUVar5 == pUVar6) {
      return true;
    }
    uc8_00 = *pUVar5;
    uVar2 = UTF_uc8_count(uc8_00);
    __c = L'?';
    if (uVar2 != 0) {
      _uc8 = CONCAT71(stack0xffffffffffffffc9,uc8_00);
      for (uVar3 = 1; pUVar4 = pUVar5 + 1, uVar2 != uVar3; uVar3 = uVar3 + 1) {
        if (pUVar4 == pUVar6) {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (us32,L'?');
          return true;
        }
        uc8[uVar3] = *pUVar4;
        pUVar5 = pUVar4;
      }
      bVar1 = UTF_uc8_to_uc32(uc8,&uc32);
      if (bVar1) {
        __c = uc32;
      }
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(us32,__c);
    pUVar5 = pUVar5 + 1;
  } while( true );
}

Assistant:

inline bool
UTF_u8_to_U(const UTF_US8& us8, UTF_US32& us32)
{
    UTF_UC8 uc8[4];
    UTF_UC32 uc32;
    UTF_US8::const_iterator it, end = us8.end();
    for (it = us8.begin(); it != end; ++it)
    {
        int count = UTF_uc8_count(UTF_STATIC_CAST(UTF_UC8, *it));
        if (!count)
        {
            if (!t_default_char)
                return false;

            us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        uc8[0] = *it;
        for (int i = 1; i < count; ++i)
        {
            ++it;
            if (it == end)
            {
                if (!t_default_char)
                    return false;

                us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
                return true;
            }
            uc8[i] = *it;
        }

        if (!UTF_uc8_to_uc32(uc8, &uc32))
        {
            if (!t_default_char)
                return false;

            us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        us32.push_back(uc32);
    }
    return true;
}